

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::QueryCapabilities
          (ConsumerEndpointImpl *this,QueryCapabilitiesCallback *callback)

{
  TracingServiceCapabilities caps;
  
  protos::gen::TracingServiceCapabilities::TracingServiceCapabilities(&caps);
  protos::gen::TracingServiceCapabilities::set_has_query_capabilities(&caps,true);
  protos::gen::TracingServiceCapabilities::set_has_trace_config_output_path(&caps,true);
  protos::gen::TracingServiceCapabilities::add_observable_events
            (&caps,ObservableEvents_Type_TYPE_DATA_SOURCES_INSTANCES);
  protos::gen::TracingServiceCapabilities::add_observable_events
            (&caps,ObservableEvents_Type_TYPE_ALL_DATA_SOURCES_STARTED);
  std::function<void_(const_perfetto::protos::gen::TracingServiceCapabilities_&)>::operator()
            (callback,&caps);
  protos::gen::TracingServiceCapabilities::~TracingServiceCapabilities(&caps);
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::QueryCapabilities(
    QueryCapabilitiesCallback callback) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  TracingServiceCapabilities caps;
  caps.set_has_query_capabilities(true);
  caps.set_has_trace_config_output_path(true);
  caps.add_observable_events(ObservableEvents::TYPE_DATA_SOURCES_INSTANCES);
  caps.add_observable_events(ObservableEvents::TYPE_ALL_DATA_SOURCES_STARTED);
  static_assert(ObservableEvents::Type_MAX ==
                    ObservableEvents::TYPE_ALL_DATA_SOURCES_STARTED,
                "");
  callback(caps);
}